

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.hpp
# Opt level: O1

int __thiscall
re::beatnik::viterbi<float,_256L>::decode(viterbi<float,_256L> *this,span<const_float,_256L> input)

{
  array<float,_256UL> *in;
  float fVar1;
  long lVar2;
  array<float,_256UL> *paVar3;
  
  calculate_transition(this,input);
  in = &this->delta;
  math::normalize<float,256l,256l>((span<const_float,_256L>)in,(span<float,_256L>)in);
  lVar2 = 0;
  paVar3 = in;
  do {
    fVar1 = *(float *)((long)(this->delta)._M_elems + lVar2 + 4);
    if (paVar3->_M_elems[0] <= fVar1 && fVar1 != paVar3->_M_elems[0]) {
      paVar3 = (array<float,_256UL> *)((long)(this->delta)._M_elems + lVar2 + 4);
    }
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x3fc);
  return *(int *)((long)this + ((long)paVar3 - (long)in) * 2 + 0x600);
}

Assistant:

int
    decode(gsl::span<T const, N> input) noexcept
    {
        calculate_transition(input);
        math::normalize(gsl::span<T, N>(delta));

        return psi[
            math::element<T>::max(
                std::cbegin(delta),
                std::cend(delta)
            ).index
        ];
    }